

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Message *msg1,Message *msg2)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *key;
  char *in_R9;
  string local_290;
  AlphaNum local_270;
  string local_240;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::ReportDifferencesToString(&differencer,__return_storage_ptr__);
  if (*(char *)((long)this + 0x1090) == '\x01') {
    util::MessageDifferencer::set_message_field_comparison(&differencer,EQUIVALENT);
  }
  if (*(long *)((long)this + 0x1100) != 0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x10f8));
    util::MessageDifferencer::IgnoreField(&differencer,pFVar2);
  }
  if (*(char *)((long)this + 0x1091) == '\x01') {
    util::MessageDifferencer::set_repeated_field_comparison(&differencer,AS_SET);
  }
  if (*(long *)((long)this + 0x10a0) != 0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x1098));
    util::MessageDifferencer::TreatAsSet(&differencer,pFVar2);
  }
  if ((*(long *)((long)this + 0x10c0) != 0) && (*(long *)((long)this + 0x10e0) != 0)) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x10b8));
    local_240._M_string_length = *(size_type *)((long)this + 0x10b8);
    local_240._M_dataplus._M_p = *(pointer *)((long)this + 0x10c0);
    gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".");
    local_270.piece_._M_str = *(char **)((long)this + 0x10d8);
    local_270.piece_._M_len = *(undefined8 *)((long)this + 0x10e0);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_290,(lts_20250127 *)&local_240,(AlphaNum *)&gtest_ar_,&local_270,
               (AlphaNum *)&gtest_ar_);
    key = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,&local_290);
    util::MessageDifferencer::TreatAsMap(&differencer,pFVar2,key);
    std::__cxx11::string::~string((string *)&local_290);
  }
  bVar1 = util::MessageDifferencer::Compare(&differencer,msg1,msg2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb9f,local_240._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    std::__cxx11::string::~string((string *)&local_240);
    if ((long *)local_270.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_270.piece_._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  return __return_storage_ptr__;
}

Assistant:

std::string Run(const Message& msg1, const Message& msg2) {
    std::string output;

    // Setup the comparison.
    util::MessageDifferencer differencer;
    differencer.ReportDifferencesToString(&output);

    if (use_equivalency_) {
      differencer.set_message_field_comparison(
          util::MessageDifferencer::EQUIVALENT);
    }

    SetSpecialFieldOption(msg1, &differencer);

    // Conduct the comparison.
    EXPECT_FALSE(differencer.Compare(msg1, msg2));

    return output;
  }